

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf.h
# Opt level: O1

vec3 * __thiscall cosine_pdf::generate(vec3 *__return_storage_ptr__,cosine_pdf *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vec3 local_28;
  
  iVar1 = rand();
  iVar2 = rand();
  dVar3 = (double)iVar2 * 4.656612873077393e-10;
  dVar4 = (double)iVar1 * 4.656612873077393e-10 * 6.283185307179586;
  dVar5 = cos(dVar4);
  dVar6 = SQRT(dVar3);
  dVar7 = dVar6;
  if (dVar3 < 0.0) {
    dVar7 = sqrt(dVar3);
  }
  dVar4 = sin(dVar4);
  if (dVar3 < 0.0) {
    dVar6 = sqrt(dVar3);
  }
  dVar3 = 1.0 - dVar3;
  if (dVar3 < 0.0) {
    local_28.e[2] = sqrt(dVar3);
  }
  else {
    local_28.e[2] = SQRT(dVar3);
  }
  local_28.e[0] = dVar5 * dVar7;
  local_28.e[1] = dVar4 * dVar6;
  onb::transform(&this->uvw,&local_28);
  return __return_storage_ptr__;
}

Assistant:

vec3 generate() const override {
        return uvw.transform(random_cosine_direction());
    }